

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_frame_codec.c
# Opt level: O1

void amqp_frame_codec_destroy(AMQP_FRAME_CODEC_HANDLE amqp_frame_codec)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (amqp_frame_codec != (AMQP_FRAME_CODEC_HANDLE)0x0) {
    frame_codec_unsubscribe(amqp_frame_codec->frame_codec,'\0');
    amqpvalue_decoder_destroy(amqp_frame_codec->decoder);
    free(amqp_frame_codec);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
               ,"amqp_frame_codec_destroy",0xce,1,"NULL amqp_frame_codec");
    return;
  }
  return;
}

Assistant:

void amqp_frame_codec_destroy(AMQP_FRAME_CODEC_HANDLE amqp_frame_codec)
{
    if (amqp_frame_codec == NULL)
    {
        /* Codes_SRS_AMQP_FRAME_CODEC_01_016: [If amqp_frame_codec is NULL, amqp_frame_codec_destroy shall do nothing.] */
        LogError("NULL amqp_frame_codec");
    }
    else
    {
        /* Codes_SRS_AMQP_FRAME_CODEC_01_017: [amqp_frame_codec_destroy shall unsubscribe from receiving AMQP frames from the frame_codec that was passed to amqp_frame_codec_create.] */
        (void)frame_codec_unsubscribe(amqp_frame_codec->frame_codec, FRAME_TYPE_AMQP);

        /* Codes_SRS_AMQP_FRAME_CODEC_01_021: [The decoder created in amqp_frame_codec_create shall be destroyed by amqp_frame_codec_destroy.] */
        amqpvalue_decoder_destroy(amqp_frame_codec->decoder);

        /* Codes_SRS_AMQP_FRAME_CODEC_01_015: [amqp_frame_codec_destroy shall free all resources associated with the amqp_frame_codec instance.] */
        free(amqp_frame_codec);
    }
}